

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int get_kf_active_quality(PRIMARY_RATE_CONTROL *p_rc,int q,aom_bit_depth_t bit_depth)

{
  int iVar1;
  uint uVar2;
  int *low_motion_minq;
  int *high_motion_minq;
  
  uVar2 = bit_depth - AOM_BITS_8;
  if (uVar2 < 5) {
    low_motion_minq = (int *)(&PTR_kf_low_motion_minq_8_00549928)[uVar2];
    high_motion_minq = (int *)(&PTR_kf_high_motion_minq_8_00549950)[uVar2];
  }
  else {
    low_motion_minq = (int *)0x0;
    high_motion_minq = (int *)0x0;
  }
  iVar1 = get_active_quality(q,p_rc->kf_boost,400,5000,low_motion_minq,high_motion_minq);
  return iVar1;
}

Assistant:

static int get_kf_active_quality(const PRIMARY_RATE_CONTROL *const p_rc, int q,
                                 aom_bit_depth_t bit_depth) {
  int *kf_low_motion_minq;
  int *kf_high_motion_minq;
  ASSIGN_MINQ_TABLE(bit_depth, kf_low_motion_minq);
  ASSIGN_MINQ_TABLE(bit_depth, kf_high_motion_minq);
  return get_active_quality(q, p_rc->kf_boost, kf_low, kf_high,
                            kf_low_motion_minq, kf_high_motion_minq);
}